

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

char * cmOutputConverter::Shell__SkipMakeVariables(char *c)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  
  while( true ) {
    pcVar3 = c;
    if (*pcVar3 != '$') {
      return pcVar3;
    }
    if (pcVar3[1] != '(') break;
    c = pcVar3 + 3;
    while ((cVar1 = c[-1], cVar1 == '_' ||
           ((cVar1 != '\0' && (iVar2 = isalpha((int)cVar1), iVar2 != 0))))) {
      c = c + 1;
    }
    if (cVar1 != ')') {
      return pcVar3;
    }
  }
  return pcVar3;
}

Assistant:

const char* cmOutputConverter::Shell__SkipMakeVariables(const char* c)
{
  while (*c == '$' && *(c + 1) == '(') {
    const char* skip = c + 2;
    while (Shell__CharIsMakeVariableName(*skip)) {
      ++skip;
    }
    if (*skip == ')') {
      c = skip + 1;
    } else {
      break;
    }
  }
  return c;
}